

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryAllocationTests.cpp
# Opt level: O3

void __thiscall
vkt::memory::anon_unknown_0::RandomAllocFreeTestInstance::~RandomAllocFreeTestInstance
          (RandomAllocFreeTestInstance *this)

{
  ~RandomAllocFreeTestInstance(this);
  operator_delete(this,0x98);
  return;
}

Assistant:

RandomAllocFreeTestInstance::~RandomAllocFreeTestInstance (void)
{
	const VkDevice							device				= m_context.getDevice();
	const DeviceInterface&					vkd					= m_context.getDeviceInterface();

	for (deUint32 heapNdx = 0; heapNdx < (deUint32)m_heaps.size(); heapNdx++)
	{
		const Heap&	heap	= m_heaps[heapNdx];

		for (size_t objectNdx = 0; objectNdx < heap.objects.size(); objectNdx++)
		{
			if (!!heap.objects[objectNdx].memory)
				vkd.freeMemory(device, heap.objects[objectNdx].memory, (const VkAllocationCallbacks*)DE_NULL);
		}
	}
}